

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_format.cc
# Opt level: O3

char * absl::lts_20240722::time_internal::cctz::detail::anon_unknown_0::ParseSubSeconds
                 (char *dp,femtoseconds *subseconds)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  if ((dp == (char *)0x0) ||
     (pvVar2 = memchr((anonymous_namespace)::kDigits,(int)*dp,0xb), pvVar2 == (void *)0x0)) {
LAB_0010b56e:
    pcVar3 = (char *)0x0;
  }
  else {
    lVar4 = 0;
    lVar6 = 0;
    lVar5 = 0;
    do {
      iVar1 = (int)pvVar2 + -0x1122d4;
      if (9 < iVar1) {
        if (lVar4 == 0) goto LAB_0010b56e;
        break;
      }
      if (lVar6 < 0xf) {
        lVar6 = lVar6 + 1;
        lVar5 = (long)iVar1 + lVar5 * 10;
      }
      pvVar2 = memchr((anonymous_namespace)::kDigits,(int)dp[lVar4 + 1],0xb);
      lVar4 = lVar4 + 1;
    } while (pvVar2 != (void *)0x0);
    pcVar3 = dp + lVar4;
    subseconds->__r = lVar5 * *(long *)((anonymous_namespace)::kExp10 + (0xf - lVar6) * 8);
  }
  return pcVar3;
}

Assistant:

const char* ParseSubSeconds(const char* dp, detail::femtoseconds* subseconds) {
  if (dp != nullptr) {
    std::int_fast64_t v = 0;
    std::int_fast64_t exp = 0;
    const char* const bp = dp;
    while (const char* cp = strchr(kDigits, *dp)) {
      int d = static_cast<int>(cp - kDigits);
      if (d >= 10) break;
      if (exp < 15) {
        exp += 1;
        v *= 10;
        v += d;
      }
      ++dp;
    }
    if (dp != bp) {
      v *= kExp10[15 - exp];
      *subseconds = detail::femtoseconds(v);
    } else {
      dp = nullptr;
    }
  }
  return dp;
}